

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlresult.cpp
# Opt level: O2

bool __thiscall QSqlResult::prepare(QSqlResult *this,QString *query)

{
  QSqlResultPrivate *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->d_ptr;
  QString::operator=(&this_00->sql,query);
  if ((this_00->holders).d.size == 0) {
    QSqlResultPrivate::namedToPositionalBinding((QString *)&QStack_38,this_00,query);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool QSqlResult::prepare(const QString& query)
{
    Q_D(QSqlResult);
    d->sql = query;
    if (d->holders.isEmpty()) {
        // parse the query to memorize parameter location
        d->namedToPositionalBinding(query);
    }
    return true; // fake prepares should always succeed
}